

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

uint __thiscall llvm::AArch64::getDefaultFPU(AArch64 *this,StringRef CPU,ArchKind AK)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  
  pcVar3 = CPU.Data;
  if (pcVar3 == (char *)0xa) {
    bVar4 = *(short *)(this + 8) == 0x3533 && *(long *)this == 0x612d786574726f63;
  }
  else {
    if ((pcVar3 == (char *)0x7) && (*(int *)(this + 3) == 0x63697265 && *(int *)this == 0x656e6567))
    {
      return *(uint *)(&DAT_001e9f30 + (CPU.Length & 0xffffffff) * 0x40);
    }
    bVar4 = false;
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3335 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3535 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3735 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3237 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3337 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3537 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x656e6f6c || *(int *)this != 0x6c637963) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x9) && (!bVar4)) {
    bVar4 = true;
    if (this[8] != (AArch64)0x31 || *(long *)this != 0x6d2d736f6e797865) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x9) && (!bVar4)) {
    bVar4 = true;
    if (this[8] != (AArch64)0x32 || *(long *)this != 0x6d2d736f6e797865) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x9) && (!bVar4)) {
    bVar4 = true;
    if (this[8] != (AArch64)0x33 || *(long *)this != 0x6d2d736f6e797865) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x9) && (!bVar4)) {
    bVar4 = true;
    if (this[8] != (AArch64)0x34 || *(long *)this != 0x6d2d736f6e797865) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x6) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 4) != 0x726f || *(int *)this != 0x6b6c6166) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x7) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 3) != 0x61726968 || *(int *)this != 0x68706173) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x4) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)this != 0x6f79726b) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xc) && (!bVar4)) {
    bVar4 = true;
    if (*(int *)(this + 8) != 0x39397432 || *(long *)this != 0x787265646e756874) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0x8) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)this != 0x787265646e756874) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xb) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)(this + 3) != 0x383874787265646e || *(long *)this != 0x787265646e756874) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xb) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)(this + 3) != 0x313874787265646e || *(long *)this != 0x787265646e756874) {
      bVar4 = false;
    }
  }
  if ((pcVar3 == (char *)0xb) && (!bVar4)) {
    bVar4 = true;
    if (*(long *)(this + 3) != 0x333874787265646e || *(long *)this != 0x787265646e756874) {
      bVar4 = false;
    }
  }
  uVar2 = 0x14;
  if (!bVar4) {
    bVar5 = false;
    if (pcVar3 == (char *)0x7) {
      bVar5 = *(int *)(this + 3) == 0x64696c61 && *(int *)this == 0x61766e69;
    }
    uVar2 = 0x14;
    if (bVar5) {
      uVar2 = 0;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  uVar1 = 0;
  if (bVar4) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

unsigned llvm::AArch64::getDefaultFPU(StringRef CPU, ArchKind AK) {
  if (CPU == "generic")
    return AArch64ARCHNames[static_cast<unsigned>(AK)].DefaultFPU;

  return StringSwitch<unsigned>(CPU)
#define AARCH64_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT) \
    .Case(NAME, DEFAULT_FPU)
#include "llvm/Support/AArch64TargetParser.def"
    .Default(ARM::FK_INVALID);
}